

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void dlib::
     isort_array<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,dlib::open_file_box_helper::case_insensitive_compare>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *array,unsigned_long left,unsigned_long right,case_insensitive_compare *comp)

{
  bool bVar1;
  reference a;
  string *in_RCX;
  string *in_RDX;
  string *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  unsigned_long j;
  unsigned_long i;
  unsigned_long pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  string *local_38;
  string *local_30;
  string *b;
  
  local_30 = in_RSI + 1;
  do {
    b = local_30;
    if (in_RDX < local_30) {
      return;
    }
    do {
      local_38 = b + -1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](in_RDI,(size_type)b);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](in_RDI,(size_type)local_38);
      bVar1 = open_file_box_helper::case_insensitive_compare::operator()
                        ((case_insensitive_compare *)in_RDX,in_RCX,b);
      if (!bVar1) break;
      a = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](in_RDI,(size_type)b);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](in_RDI,(size_type)local_38);
      exchange<std::__cxx11::string>(a,in_stack_ffffffffffffffa8);
      b = local_38;
    } while (local_38 != in_RSI);
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

void isort_array (
        T& array,
        const unsigned long left,
        const unsigned long right,
        const compare& comp
    )
    {
        DLIB_ASSERT (left <= right,
                "\tvoid isort_array()"
                << "\n\tleft:          " << left
                << "\n\tright:         " << right );
        using namespace sort_helpers;

        unsigned long pos;
        for (unsigned long i = left+1; i <= right; ++i)
        {
            // everything from left to i-1 is sorted.
            pos = i;
            for (unsigned long j = i-1; comp(array[pos] , array[j]); --j)
            {
                exchange(array[pos],array[j]);
                pos = j;
                
                if (j == left)
                    break;
            }
        }
    }